

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O3

void __thiscall xLearn::CSVParser::~CSVParser(CSVParser *this)

{
  pointer pcVar1;
  
  (this->super_Parser)._vptr_Parser = (_func_int **)&PTR__Parser_001b4728;
  pcVar1 = (this->super_Parser).splitor_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_Parser).splitor_.field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

~CSVParser() { }